

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * fs_getcwd(char *buffer,int buffer_size)

{
  char *pcVar1;
  int in_ESI;
  char *in_RDI;
  int in_stack_ffffffffffffffe8;
  char *local_8;
  
  dbg_assert_imp(in_RDI,in_ESI,in_stack_ffffffffffffffe8,(char *)0x2571c7);
  dbg_assert_imp(in_RDI,in_ESI,in_stack_ffffffffffffffe8,(char *)0x2571ec);
  pcVar1 = getcwd(in_RDI,(long)in_ESI);
  local_8 = in_RDI;
  if (pcVar1 == (char *)0x0) {
    *in_RDI = '\0';
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *fs_getcwd(char *buffer, int buffer_size)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR wBuffer[IO_MAX_PATH_LENGTH];
#endif
	dbg_assert(buffer != 0, "buffer invalid");
	dbg_assert(buffer_size > 0, "buffer_size invalid");
#if defined(CONF_FAMILY_WINDOWS)
	if(_wgetcwd(wBuffer, buffer_size) == 0)
	{
		buffer[0] = '\0';
		return 0;
	}
	WideCharToMultiByte(CP_UTF8, 0, wBuffer, -1, buffer, buffer_size, NULL, NULL);
	return buffer;
#else
	if(getcwd(buffer, buffer_size) == 0)
	{
		buffer[0] = '\0';
		return 0;
	}
	return buffer;
#endif
}